

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall
draco::CornerTable::Init
          (CornerTable *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *faces)

{
  bool bVar1;
  size_t sVar2;
  reference this_00;
  ValenceCache<draco::CornerTable> *in_RDI;
  int num_vertices;
  int i;
  FaceIndex fi;
  int *in_stack_00000190;
  CornerTable *in_stack_00000198;
  CornerTable *in_stack_000001a0;
  int in_stack_0000022c;
  CornerTable *in_stack_00000230;
  CornerTable *in_stack_ffffffffffffffb8;
  int local_24;
  uint local_20;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_1c [3];
  ValenceCache<draco::CornerTable> *this_01;
  bool local_1;
  
  this_01 = in_RDI;
  ValenceCache<draco::CornerTable>::ClearValenceCache(in_RDI);
  ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate(this_01);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *)0x187db9);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
  ::resize((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
            *)in_RDI,(size_t)in_stack_ffffffffffffffb8);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(local_1c,0);
  while( true ) {
    sVar2 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
            ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                    *)0x187ddd);
    local_20 = (uint)sVar2;
    bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<(local_1c,&local_20);
    if (!bVar1) break;
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
      ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                    *)in_RDI,
                   (IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)in_stack_ffffffffffffffb8)
      ;
      in_stack_ffffffffffffffb8 =
           (CornerTable *)
           std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::operator[]
                     ((array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL> *)
                      in_RDI,(size_type)in_stack_ffffffffffffffb8);
      FirstCorner(in_stack_ffffffffffffffb8,(FaceIndex)(uint)in_RDI);
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+
                ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)in_stack_ffffffffffffffb8,
                 (uint *)0x187e5d);
      this_00 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                              *)in_RDI,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             in_stack_ffffffffffffffb8);
      IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                (this_00,(ThisIndexType *)in_stack_ffffffffffffffb8);
    }
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(local_1c);
  }
  bVar1 = ComputeOppositeCorners(in_stack_00000198,in_stack_00000190);
  if (bVar1) {
    bVar1 = BreakNonManifoldEdges(in_stack_000001a0);
    if (bVar1) {
      bVar1 = ComputeVertexCorners(in_stack_00000230,in_stack_0000022c);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool CornerTable::Init(const IndexTypeVector<FaceIndex, FaceType> &faces) {
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  corner_to_vertex_map_.resize(faces.size() * 3);
  for (FaceIndex fi(0); fi < static_cast<uint32_t>(faces.size()); ++fi) {
    for (int i = 0; i < 3; ++i) {
      corner_to_vertex_map_[FirstCorner(fi) + i] = faces[fi][i];
    }
  }
  int num_vertices = -1;
  if (!ComputeOppositeCorners(&num_vertices)) {
    return false;
  }
  if (!BreakNonManifoldEdges()) {
    return false;
  }
  if (!ComputeVertexCorners(num_vertices)) {
    return false;
  }
  return true;
}